

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::~RefcountedTemplate(RefcountedTemplate *this)

{
  int iVar1;
  
  if (this->ptr_ != (Template *)0x0) {
    (*this->ptr_->_vptr_Template[1])();
  }
  if (((this->mutex_).destroy_ == true) && ((this->mutex_).is_safe_ == true)) {
    iVar1 = pthread_rwlock_destroy((pthread_rwlock_t *)&this->mutex_);
    if (iVar1 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

~RefcountedTemplate() { delete ptr_; }